

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls_preset_coding_parameters.h
# Opt level: O1

jpegls_pc_parameters *
charls::compute_default
          (jpegls_pc_parameters *__return_storage_ptr__,int32_t maximum_sample_value,
          int32_t near_lossless)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (0xffff < maximum_sample_value) {
    __assert_fail("maximum_sample_value <= std::numeric_limits<uint16_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                  ,0x18,"jpegls_pc_parameters charls::compute_default(const int32_t, const int32_t)"
                 );
  }
  if (-1 < near_lossless) {
    iVar1 = maximum_sample_value / 2;
    if (0xfe < iVar1) {
      iVar1 = 0xff;
    }
    if (near_lossless <= iVar1) {
      iVar1 = near_lossless + 1;
      __return_storage_ptr__->maximum_sample_value = maximum_sample_value;
      if (maximum_sample_value < 0x80) {
        iVar5 = (int)(0x100 / (long)(maximum_sample_value + 1));
        iVar3 = (int)(3 / (long)iVar5) + near_lossless * 3;
        iVar4 = 2;
        if (2 < iVar3) {
          iVar4 = iVar3;
        }
        iVar3 = iVar1;
        if (iVar1 < iVar4) {
          iVar3 = iVar4;
        }
        if (maximum_sample_value < iVar4) {
          iVar3 = iVar1;
        }
        iVar1 = (int)(7 / (long)iVar5) + near_lossless * 5;
        if (iVar1 < 4) {
          iVar1 = 3;
        }
        iVar4 = iVar3;
        if (iVar3 < iVar1) {
          iVar4 = iVar1;
        }
        if (maximum_sample_value < iVar1) {
          iVar4 = iVar3;
        }
        __return_storage_ptr__->threshold1 = iVar3;
        __return_storage_ptr__->threshold2 = iVar4;
        iVar3 = (int)(0x15 / (long)iVar5) + near_lossless * 7;
        iVar1 = 4;
        if (4 < iVar3) {
          iVar1 = iVar3;
        }
        iVar3 = iVar4;
        if (iVar4 < iVar1) {
          iVar3 = iVar1;
        }
      }
      else {
        iVar4 = 0xfff;
        if (maximum_sample_value < 0xfff) {
          iVar4 = maximum_sample_value;
        }
        uVar2 = iVar4 + 0x80U >> 8;
        iVar4 = near_lossless * 3 + uVar2 + 2;
        iVar3 = iVar1;
        if (iVar1 < iVar4) {
          iVar3 = iVar4;
        }
        if (maximum_sample_value < iVar4) {
          iVar3 = iVar1;
        }
        iVar1 = near_lossless * 5 + uVar2 * 4 + 3;
        iVar4 = iVar3;
        if (iVar3 < iVar1) {
          iVar4 = iVar1;
        }
        if (maximum_sample_value < iVar1) {
          iVar4 = iVar3;
        }
        __return_storage_ptr__->threshold1 = iVar3;
        iVar1 = uVar2 * 0x11 + near_lossless * 7 + 4;
        iVar3 = iVar4;
        if (iVar4 < iVar1) {
          iVar3 = iVar1;
        }
        __return_storage_ptr__->threshold2 = iVar4;
      }
      if (maximum_sample_value < iVar1) {
        iVar3 = iVar4;
      }
      __return_storage_ptr__->threshold3 = iVar3;
      __return_storage_ptr__->reset_value = 0x40;
      return __return_storage_ptr__;
    }
  }
  __assert_fail("near_lossless >= 0 && near_lossless <= compute_maximum_near_lossless(maximum_sample_value)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                ,0x19,"jpegls_pc_parameters charls::compute_default(const int32_t, const int32_t)");
}

Assistant:

inline jpegls_pc_parameters compute_default(const int32_t maximum_sample_value, const int32_t near_lossless) noexcept
{
    ASSERT(maximum_sample_value <= std::numeric_limits<uint16_t>::max());
    ASSERT(near_lossless >= 0 && near_lossless <= compute_maximum_near_lossless(maximum_sample_value));

    if (maximum_sample_value >= 128)
    {
        const int32_t factor{(std::min(maximum_sample_value, 4095) + 128) / 256};
        const int threshold1{
            clamp(factor * (default_threshold1 - 2) + 2 + 3 * near_lossless, near_lossless + 1, maximum_sample_value)};
        const int threshold2{
            clamp(factor * (default_threshold2 - 3) + 3 + 5 * near_lossless, threshold1, maximum_sample_value)};

        return {maximum_sample_value, threshold1, threshold2,
                clamp(factor * (default_threshold3 - 4) + 4 + 7 * near_lossless, threshold2, maximum_sample_value),
                default_reset_value};
    }

    const int32_t factor{256 / (maximum_sample_value + 1)};
    const int threshold1{
        clamp(std::max(2, default_threshold1 / factor + 3 * near_lossless), near_lossless + 1, maximum_sample_value)};
    const int threshold2{
        clamp(std::max(3, default_threshold2 / factor + 5 * near_lossless), threshold1, maximum_sample_value)};

    return {maximum_sample_value, threshold1, threshold2,
            clamp(std::max(4, default_threshold3 / factor + 7 * near_lossless), threshold2, maximum_sample_value),
            default_reset_value};
}